

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

StringStream<4096UL,_4096UL> * __thiscall
spirv_cross::StringStream<4096UL,_4096UL>::operator<<(StringStream<4096UL,_4096UL> *this,uint32_t v)

{
  char *s_00;
  size_t len;
  undefined1 local_38 [8];
  string s;
  uint32_t v_local;
  StringStream<4096UL,_4096UL> *this_local;
  
  s.field_2._12_4_ = v;
  ::std::__cxx11::to_string((string *)local_38,v);
  s_00 = (char *)::std::__cxx11::string::data();
  len = ::std::__cxx11::string::size();
  append(this,s_00,len);
  ::std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

StringStream &operator<<(uint32_t v)
	{
		auto s = std::to_string(v);
		append(s.data(), s.size());
		return *this;
	}